

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::FixOrientations(ClipperOffset *this)

{
  value_type pPVar1;
  bool bVar2;
  int iVar3;
  reference ppPVar4;
  PolyNode *node_1;
  int i_1;
  PolyNode *node;
  int i;
  ClipperOffset *this_local;
  
  if (-1 < (this->m_lowest).X) {
    ppPVar4 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[](&(this->m_polyNodes).Childs,(long)(int)(this->m_lowest).X);
    bVar2 = Orientation(&(*ppPVar4)->Contour);
    if (!bVar2) {
      for (node._4_4_ = 0; iVar3 = PolyNode::ChildCount(&this->m_polyNodes), node._4_4_ < iVar3;
          node._4_4_ = node._4_4_ + 1) {
        ppPVar4 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                  operator[](&(this->m_polyNodes).Childs,(long)node._4_4_);
        pPVar1 = *ppPVar4;
        if ((pPVar1->m_endtype == etClosedPolygon) ||
           ((pPVar1->m_endtype == etClosedLine && (bVar2 = Orientation(&pPVar1->Contour), bVar2))))
        {
          ReversePath(&pPVar1->Contour);
        }
      }
      return;
    }
  }
  for (node_1._4_4_ = 0; iVar3 = PolyNode::ChildCount(&this->m_polyNodes), node_1._4_4_ < iVar3;
      node_1._4_4_ = node_1._4_4_ + 1) {
    ppPVar4 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[](&(this->m_polyNodes).Childs,(long)node_1._4_4_);
    pPVar1 = *ppPVar4;
    if ((pPVar1->m_endtype == etClosedLine) && (bVar2 = Orientation(&pPVar1->Contour), !bVar2)) {
      ReversePath(&pPVar1->Contour);
    }
  }
  return;
}

Assistant:

void ClipperOffset::FixOrientations()
{
  //fixup orientations of all closed paths if the orientation of the
  //closed path with the lowermost vertex is wrong ...
  if (m_lowest.X >= 0 && 
    !Orientation(m_polyNodes.Childs[(int)m_lowest.X]->Contour))
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon ||
        (node.m_endtype == etClosedLine && Orientation(node.Contour)))
          ReversePath(node.Contour);
    }
  } else
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedLine && !Orientation(node.Contour))
        ReversePath(node.Contour);
    }
  }
}